

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::DirectStateAccess::Buffers::SubDataQueryTest::iterate(SubDataQueryTest *this)

{
  ostringstream *this_00;
  PFNGLNAMEDBUFFERDATA p_Var1;
  PFNGLGETNAMEDBUFFERSUBDATA p_Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  undefined4 extraout_var;
  long lVar8;
  undefined4 *puVar9;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  GLuint buffer;
  GLuint data [12];
  undefined1 local_1a8 [384];
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access")
  ;
  if ((bVar3) || (bVar4)) {
    buffer = 0;
    p_Var1 = *(PFNGLNAMEDBUFFERDATA *)(lVar7 + 0xec0);
    this->m_pNamedBufferData = p_Var1;
    p_Var2 = *(PFNGLGETNAMEDBUFFERSUBDATA *)(lVar7 + 0x908);
    this->m_pGetNamedBufferSubData = p_Var2;
    if ((p_Var1 == (PFNGLNAMEDBUFFERDATA)0x0) || (p_Var2 == (PFNGLGETNAMEDBUFFERSUBDATA)0x0)) {
      puVar9 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar9 = 0;
      __cxa_throw(puVar9,&int::typeinfo,0);
    }
    (**(code **)(lVar7 + 0x3b8))(1,&buffer);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glCreateBuffers failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x866);
    (*this->m_pNamedBufferData)(buffer,0x30,&s_reference,0x88ea);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glNamedBufferData failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x86a);
    data[8] = 0;
    data[9] = 0;
    data[10] = 0;
    data[0xb] = 0;
    data[4] = 0;
    data[5] = 0;
    data[6] = 0;
    data[7] = 0;
    data[0] = 0;
    data[1] = 0;
    data[2] = 0;
    data[3] = 0;
    (*this->m_pGetNamedBufferSubData)(buffer,0,0x18,data);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGetNamedBufferSubData failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x86f);
    (*this->m_pGetNamedBufferSubData)(buffer,0x18,0x18,data + 6);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"glGetNamedBufferSubData failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessBuffersTests.cpp"
                    ,0x872);
    bVar3 = true;
    for (lVar8 = 0; lVar8 != 0x30; lVar8 = lVar8 + 4) {
      bVar3 = (bool)(bVar3 & *(int *)((long)data + lVar8) == *(int *)((long)&s_reference + lVar8));
    }
    if (!bVar3) {
      local_1a8._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(this_00);
      std::operator<<((ostream *)this_00,
                      "glGetNamedBufferSubData returned data which is not identical to reference data."
                     );
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_00);
    }
    if (buffer != 0) {
      (**(code **)(lVar7 + 0x438))(1);
      buffer = 0;
    }
    do {
      iVar5 = (**(code **)(lVar7 + 0x800))();
    } while (iVar5 != 0);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar3) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_01,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SubDataQueryTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	glw::GLuint buffer = 0;

	m_pNamedBufferData		 = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pGetNamedBufferSubData = (PFNGLGETNAMEDBUFFERSUBDATA)gl.getNamedBufferSubData;

	try
	{
		if ((DE_NULL == m_pNamedBufferData) || (DE_NULL == m_pGetNamedBufferSubData))
		{
			throw 0;
		}

		/* Buffer creation. */
		gl.createBuffers(1, &buffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateBuffers failed.");

		/* Buffer's storage allocation and reference data upload. */
		m_pNamedBufferData(buffer, s_reference_size, s_reference, GL_DYNAMIC_COPY);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glNamedBufferData failed.");

		/* Mapping with new named buffer map function. */
		glw::GLuint data[s_reference_count] = {};
		m_pGetNamedBufferSubData(buffer, 0, s_reference_size / 2, data);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetNamedBufferSubData failed.");

		m_pGetNamedBufferSubData(buffer, s_reference_size / 2, s_reference_size / 2, &data[s_reference_count / 2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetNamedBufferSubData failed.");

		/* Comparison results with reference data. */
		for (glw::GLsizei i = 0; i < s_reference_count; ++i)
		{
			is_ok &= (data[i] == s_reference[i]);
		}

		if (!is_ok)
		{
			/* Log. */
			m_context.getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "glGetNamedBufferSubData returned data which is not identical to reference data."
				<< tcu::TestLog::EndMessage;
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (buffer)
	{
		gl.deleteBuffers(1, &buffer);

		buffer = false;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}